

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

size_t Assimp::parseMagic(uint8_t *data,uint8_t *dataEnd)

{
  char *__s;
  uint uVar1;
  int iVar2;
  size_t __n;
  long lVar3;
  
  if (3 < (long)dataEnd - (long)data) {
    uVar1 = *(uint *)data;
    uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (uVar1 == 0xe0000001) {
      return 4;
    }
    if (uVar1 == 0x3c3f786d) {
      lVar3 = 0;
      do {
        __s = *(char **)((long)&xmlDeclarations + lVar3);
        __n = strlen(__s);
        if (((long)__n <= (long)dataEnd - (long)data) && (iVar2 = bcmp(__s,data,__n), iVar2 == 0)) {
          if ((long)dataEnd - (long)(data + __n) < 4) {
            return 0;
          }
          uVar1 = *(uint *)(data + __n);
          if ((uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) ==
              0xe0000001) {
            return __n + 4;
          }
          return 0;
        }
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x48);
    }
  }
  return 0;
}

Assistant:

static size_t parseMagic(const uint8_t *data, const uint8_t *dataEnd) {
    if (dataEnd - data < 4) {
        return 0;
    }
    uint32_t magic = (data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3];
    switch (magic) {
    case 0xe0000001:
        return 4;
    case 0x3c3f786d: // "<?xm"
        {
            size_t xmlDeclarationsLength = sizeof(xmlDeclarations) / sizeof(xmlDeclarations[0]);
            for (size_t i = 0; i < xmlDeclarationsLength; ++i) {
                auto xmlDeclaration = xmlDeclarations[i];
                ptrdiff_t xmlDeclarationLength = strlen(xmlDeclaration);
                if ((dataEnd - data >= xmlDeclarationLength) && (memcmp(xmlDeclaration, data, xmlDeclarationLength) == 0)) {
                    data += xmlDeclarationLength;
                    if (dataEnd - data < 4) {
                        return 0;
                    }
                    magic = (data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3];
                    return magic == 0xe0000001 ? xmlDeclarationLength + 4 : 0;
                }
            }
            return 0;
        }
    default:
        return 0;
    }
}